

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

int json_object_object_to_json_string(json_object *jso,printbuf *pb,int level,int flags)

{
  bool bVar1;
  int iVar2;
  lh_table *t;
  size_t len;
  json_object *local_50;
  char *local_48;
  json_object_iter iter;
  int had_children;
  int flags_local;
  int level_local;
  printbuf *pb_local;
  json_object *jso_local;
  
  bVar1 = false;
  printbuf_memappend(pb,"{",1);
  t = json_object_get_object(jso);
  iter.val = (json_object *)lh_table_head(t);
  while( true ) {
    if (iter.val == (json_object *)0x0) {
      local_50 = (json_object *)0x0;
    }
    else {
      local_48 = (char *)lh_entry_k((lh_entry *)iter.val);
      iter.key = (char *)lh_entry_v((lh_entry *)iter.val);
      local_50 = iter.val;
    }
    if (local_50 == (json_object *)0x0) break;
    if (bVar1) {
      printbuf_memappend(pb,",",1);
    }
    if ((flags & 2U) != 0) {
      printbuf_memappend(pb,"\n",1);
    }
    bVar1 = true;
    if (((flags & 1U) != 0) && ((flags & 2U) == 0)) {
      printbuf_memappend(pb," ",1);
    }
    indent(pb,level + 1,flags);
    if ((flags & 0x20U) != 0) {
      printbuf_memappend(pb,"\x1b[0;34m",7);
    }
    printbuf_memappend(pb,"\"",1);
    len = strlen(local_48);
    json_escape_str(pb,local_48,len,flags);
    printbuf_memappend(pb,"\"",1);
    if ((flags & 0x20U) != 0) {
      printbuf_memappend(pb,"\x1b[0m",4);
    }
    if ((flags & 1U) == 0) {
      printbuf_memappend(pb,":",1);
    }
    else {
      printbuf_memappend(pb,": ",2);
    }
    if (iter.key == (char *)0x0) {
      if ((flags & 0x20U) != 0) {
        printbuf_memappend(pb,"\x1b[0;35m",7);
      }
      printbuf_memappend(pb,"null",4);
      if ((flags & 0x20U) != 0) {
        printbuf_memappend(pb,"\x1b[0m",4);
      }
    }
    else {
      iVar2 = (**(code **)(iter.key + 8))(iter.key,pb,level + 1,flags);
      if (iVar2 < 0) {
        return -1;
      }
    }
    iter.val = (json_object *)lh_entry_next((lh_entry *)iter.val);
  }
  if (((flags & 2U) != 0) && (bVar1)) {
    printbuf_memappend(pb,"\n",1);
    indent(pb,level,flags);
  }
  if (((flags & 1U) != 0) && ((flags & 2U) == 0)) {
    iVar2 = printbuf_memappend(pb," }",2);
    return iVar2;
  }
  iVar2 = printbuf_memappend(pb,"}",1);
  return iVar2;
}

Assistant:

static int json_object_object_to_json_string(struct json_object *jso, struct printbuf *pb,
                                             int level, int flags)
{
	int had_children = 0;
	struct json_object_iter iter;

	printbuf_strappend(pb, "{" /*}*/);
	json_object_object_foreachC(jso, iter)
	{
		if (had_children)
		{
			printbuf_strappend(pb, ",");
		}
		if (flags & JSON_C_TO_STRING_PRETTY)
			printbuf_strappend(pb, "\n");
		had_children = 1;
		if (flags & JSON_C_TO_STRING_SPACED && !(flags & JSON_C_TO_STRING_PRETTY))
			printbuf_strappend(pb, " ");
		indent(pb, level + 1, flags);
		if (flags & JSON_C_TO_STRING_COLOR)
			printbuf_strappend(pb, ANSI_COLOR_FG_BLUE);

		printbuf_strappend(pb, "\"");
		json_escape_str(pb, iter.key, strlen(iter.key), flags);
		printbuf_strappend(pb, "\"");

		if (flags & JSON_C_TO_STRING_COLOR)
			printbuf_strappend(pb, ANSI_COLOR_RESET);

		if (flags & JSON_C_TO_STRING_SPACED)
			printbuf_strappend(pb, ": ");
		else
			printbuf_strappend(pb, ":");

		if (iter.val == NULL) {
			if (flags & JSON_C_TO_STRING_COLOR)
				printbuf_strappend(pb, ANSI_COLOR_FG_MAGENTA);
			printbuf_strappend(pb, "null");
			if (flags & JSON_C_TO_STRING_COLOR)
				printbuf_strappend(pb, ANSI_COLOR_RESET);
		} else if (iter.val->_to_json_string(iter.val, pb, level + 1, flags) < 0)
			return -1;
	}
	if ((flags & JSON_C_TO_STRING_PRETTY) && had_children)
	{
		printbuf_strappend(pb, "\n");
		indent(pb, level, flags);
	}
	if (flags & JSON_C_TO_STRING_SPACED && !(flags & JSON_C_TO_STRING_PRETTY))
		return printbuf_strappend(pb, /*{*/ " }");
	else
		return printbuf_strappend(pb, /*{*/ "}");
}